

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeCompositeConstant
          (Builder *this,Id typeId,vector<unsigned_int,_std::allocator<unsigned_int>_> *members,
          bool specConstant)

{
  size_t this_00;
  Id IVar1;
  Instruction *this_01;
  size_type count;
  const_reference pvVar2;
  mapped_type *pmVar3;
  Op local_a0;
  bool local_99;
  Op local_8c;
  value_type local_88;
  ulong local_80;
  size_t op;
  Instruction *c;
  undefined4 local_68;
  Id existing_1;
  Id existing;
  Op opcode;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  size_t local_40;
  size_t numMembers;
  Op local_30;
  bool replicate;
  Op typeClass;
  bool specConstant_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *members_local;
  Builder *pBStack_18;
  Id typeId_local;
  Builder *this_local;
  
  replicate = specConstant;
  _typeClass = members;
  members_local._4_4_ = typeId;
  pBStack_18 = this;
  if (typeId == 0) {
    __assert_fail("typeId",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x765,"Id spv::Builder::makeCompositeConstant(Id, const std::vector<Id> &, bool)"
                 );
  }
  local_30 = getTypeClass(this,typeId);
  numMembers._7_1_ = 0;
  local_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_typeClass);
  if (((this->useReplicatedComposites & 1U) != 0) || (local_30 == OpTypeCooperativeVectorNV)) {
    local_99 = false;
    if (local_40 != 0) {
      local_50._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(_typeClass);
      local_48 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+(&local_50,1);
      local_58._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(_typeClass);
      _existing = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(_typeClass);
      local_99 = std::
                 equal<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (local_48,local_58,
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             )_existing);
    }
    numMembers._7_1_ = local_99;
    if (local_99 != false) {
      local_40 = 1;
      addCapability(this,CapabilityReplicatedCompositesEXT);
      addExtension(this,"SPV_EXT_replicated_composites");
    }
  }
  if ((numMembers._7_1_ & 1) == 0) {
    local_a0 = OpConstantComposite;
    if ((replicate & 1U) != 0) {
      local_a0 = OpSpecConstantComposite;
    }
  }
  else {
    local_a0 = OpConstantCompositeReplicateEXT;
    if ((replicate & 1U) != 0) {
      local_a0 = OpSpecConstantCompositeReplicateEXT;
    }
  }
  existing_1 = local_a0;
  if ((1 < local_30 - OpTypeVector) && (local_30 != OpTypeArray)) {
    if (local_30 == OpTypeStruct) {
      if ((replicate & 1U) == 0) {
        IVar1 = findStructConstant(this,members_local._4_4_,_typeClass);
        if (IVar1 != 0) {
          return IVar1;
        }
        c._4_4_ = 0;
      }
      goto LAB_00608d88;
    }
    if (((local_30 != OpTypeCooperativeMatrixKHR) && (local_30 != OpTypeCooperativeVectorNV)) &&
       (local_30 != OpTypeCooperativeMatrixNV)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x78f,
                    "Id spv::Builder::makeCompositeConstant(Id, const std::vector<Id> &, bool)");
    }
  }
  if ((replicate & 1U) == 0) {
    IVar1 = findCompositeConstant(this,local_30,local_a0,members_local._4_4_,_typeClass,local_40);
    if (IVar1 != 0) {
      return IVar1;
    }
    local_68 = 0;
  }
LAB_00608d88:
  this_01 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_01,IVar1,members_local._4_4_,existing_1);
  op = (size_t)this_01;
  count = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_typeClass);
  spv::Instruction::reserveOperands(this_01,count);
  for (local_80 = 0; this_00 = op, local_80 < local_40; local_80 = local_80 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_typeClass,local_80);
    spv::Instruction::addIdOperand((Instruction *)this_00,*pvVar2);
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_88,
             (pointer)op);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_88);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_88);
  if (local_30 == OpTypeStruct) {
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedStructConstants,(key_type *)((long)&members_local + 4));
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (pmVar3,(value_type *)&op);
  }
  else {
    local_8c = local_30;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedConstants,&local_8c);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (pmVar3,(value_type *)&op);
  }
  Module::mapInstruction(&this->module,(Instruction *)op);
  IVar1 = spv::Instruction::getResultId((Instruction *)op);
  return IVar1;
}

Assistant:

Id Builder::makeCompositeConstant(Id typeId, const std::vector<Id>& members, bool specConstant)
{
    assert(typeId);
    Op typeClass = getTypeClass(typeId);

    bool replicate = false;
    size_t numMembers = members.size();
    if (useReplicatedComposites || typeClass == OpTypeCooperativeVectorNV) {
        // use replicate if all members are the same
        replicate = numMembers > 0 &&
            std::equal(members.begin() + 1, members.end(), members.begin());

        if (replicate) {
            numMembers = 1;
            addCapability(spv::CapabilityReplicatedCompositesEXT);
            addExtension(spv::E_SPV_EXT_replicated_composites);
        }
    }

    Op opcode = replicate ?
        (specConstant ? OpSpecConstantCompositeReplicateEXT : OpConstantCompositeReplicateEXT) :
        (specConstant ? OpSpecConstantComposite : OpConstantComposite);

    switch (typeClass) {
    case OpTypeVector:
    case OpTypeArray:
    case OpTypeMatrix:
    case OpTypeCooperativeMatrixKHR:
    case OpTypeCooperativeMatrixNV:
    case OpTypeCooperativeVectorNV:
        if (! specConstant) {
            Id existing = findCompositeConstant(typeClass, opcode, typeId, members, numMembers);
            if (existing)
                return existing;
        }
        break;
    case OpTypeStruct:
        if (! specConstant) {
            Id existing = findStructConstant(typeId, members);
            if (existing)
                return existing;
        }
        break;
    default:
        assert(0);
        return makeFloatConstant(0.0);
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->reserveOperands(members.size());
    for (size_t op = 0; op < numMembers; ++op)
        c->addIdOperand(members[op]);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    if (typeClass == OpTypeStruct)
        groupedStructConstants[typeId].push_back(c);
    else
        groupedConstants[typeClass].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}